

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_515e1e::HandleArchiveCreateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  __l;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *pcVar4;
  cmArgumentParser<Arguments> *pcVar5;
  reference str;
  cmMakefile *mf;
  ulong uVar6;
  pointer ppVar7;
  long lVar8;
  char *pcVar9;
  static_string_view sVar10;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar11;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  *local_8d8;
  cmAlphaNum local_7d8;
  cmAlphaNum local_7a8;
  string local_778;
  allocator<char> local_751;
  string local_750;
  cmAlphaNum local_730;
  cmAlphaNum local_700;
  string local_6d0;
  cmAlphaNum local_6b0;
  cmAlphaNum local_680;
  string local_650;
  cmAlphaNum local_630;
  cmAlphaNum local_600;
  string local_5d0;
  int local_5ac;
  undefined1 local_5a8 [4];
  int compressionLevel;
  cmAlphaNum local_578;
  string local_548;
  _Self local_528;
  _Self local_520;
  iterator typeIt;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  local_50e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50d;
  cmTarCompression compress;
  cmTarCompression local_508 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  *local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_4c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_450;
  iterator local_428;
  size_type local_420;
  cmAlphaNum local_418;
  cmAlphaNum local_3e8;
  string local_3b8;
  char *local_398;
  char *zipFileFormats [2];
  cmAlphaNum local_358;
  string local_328;
  char *local_308;
  char *knownFormats [6];
  cmAlphaNum local_2d0;
  cmAlphaNum local_2a0;
  string local_270;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  iterator argIt;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_230;
  undefined1 local_220 [8];
  Arguments parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  cmArgumentParser<Arguments> local_98;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if (((anonymous_namespace)::
       HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_98);
    sVar10 = ::cm::operator____s("OUTPUT",6);
    pcVar4 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>
                          ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                            *)&local_98,sVar10,0x30);
    sVar10 = ::cm::operator____s("FORMAT",6);
    pcVar4 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar4,sVar10,0x50);
    sVar10 = ::cm::operator____s("COMPRESSION",0xb);
    pcVar4 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar4,sVar10,0x70);
    sVar10 = ::cm::operator____s("COMPRESSION_LEVEL",0x11);
    pcVar4 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar4,sVar10,0x90);
    sVar10 = ::cm::operator____s("MTIME",5);
    pcVar5 = cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<ArgumentParser::Maybe<std::__cxx11::string>>(pcVar4,sVar10,0xb0);
    sVar10 = ::cm::operator____s("VERBOSE",7);
    pcVar4 = (cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<Arguments>::Bind<bool>(pcVar5,sVar10,0xd0);
    sVar10 = ::cm::operator____s("PATHS",5);
    pcVar5 = cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::
             Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (pcVar4,sVar10,0xd8);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleArchiveCreateCommand::parser,pcVar5);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_98);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleArchiveCreateCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parsedArgs.Paths.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cVar11 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local);
  argIt._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar11.Begin._M_current;
  local_230 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&argIt,1);
  cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_220,
             (cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&HandleArchiveCreateCommand::parser,&local_230,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsedArgs.Paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_248._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parsedArgs.Paths.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_250._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsedArgs.Paths.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = __gnu_cxx::operator!=(&local_248,&local_250);
  pcVar1 = local_20;
  if (bVar2) {
    cmAlphaNum::cmAlphaNum(&local_2a0,"Unrecognized argument: \"");
    str = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_248);
    cmAlphaNum::cmAlphaNum(&local_2d0,str);
    cmStrCat<char[2]>(&local_270,&local_2a0,&local_2d0,(char (*) [2])0xc4a1e0);
    cmExecutionStatus::SetError(pcVar1,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 0;
  }
  else {
    mf = cmExecutionStatus::GetMakefile(local_20);
    bVar2 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_220,mf);
    if (bVar2) {
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 1;
    }
    else {
      memcpy(&local_308,&DAT_00fae760,0x30);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        bVar2 = ::cm::
                contains<const_char_*[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((char *(*) [6])&local_308,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&parsedArgs.Output.field_2 + 8));
        pcVar1 = local_20;
        if (!bVar2) {
          cmAlphaNum::cmAlphaNum(&local_358,"archive format ");
          cmAlphaNum::cmAlphaNum
                    ((cmAlphaNum *)(zipFileFormats + 1),
                     (string *)((long)&parsedArgs.Output.field_2 + 8));
          cmStrCat<char[15]>(&local_328,&local_358,(cmAlphaNum *)(zipFileFormats + 1),
                             (char (*) [15])0xc9b251);
          cmExecutionStatus::SetError(pcVar1,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          goto LAB_003bd390;
        }
      }
      local_398 = "7zip";
      zipFileFormats[0] = "zip";
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        bVar2 = ::cm::
                contains<const_char_*[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((char *(*) [2])&local_398,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&parsedArgs.Output.field_2 + 8));
        pcVar1 = local_20;
        if (bVar2) {
          cmAlphaNum::cmAlphaNum(&local_3e8,"archive format ");
          cmAlphaNum::cmAlphaNum(&local_418,(string *)((long)&parsedArgs.Output.field_2 + 8));
          cmStrCat<char[40]>(&local_3b8,&local_3e8,&local_418,
                             (char (*) [40])" does not support COMPRESSION arguments");
          cmExecutionStatus::SetError(pcVar1,&local_3b8);
          std::__cxx11::string::~string((string *)&local_3b8);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          goto LAB_003bd390;
        }
      }
      if ((anonymous_namespace)::
          HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::compressionTypeMap_abi_cxx11_ == '\0') {
        iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::compressionTypeMap_abi_cxx11_);
        if (iVar3 != 0) {
          local_4f8 = &local_4f0;
          local_508[3] = 4;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (local_4f8,(char (*) [5])0xc51867,local_508 + 3);
          local_4f8 = &local_4c8;
          local_508[2] = 1;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[6],_cmSystemTools::cmTarCompression,_true>
                    (local_4f8,(char (*) [6])"BZip2",local_508 + 2);
          local_4f8 = &local_4a0;
          local_508[1] = 0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (local_4f8,(char (*) [5])"GZip",local_508 + 1);
          local_4f8 = &local_478;
          local_508[0] = TarCompressXZ;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[3],_cmSystemTools::cmTarCompression,_true>
                    (local_4f8,(char (*) [3])"XZ",local_508);
          local_4f8 = &local_450;
          compress = TarCompressZstd;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (local_4f8,(char (*) [5])"Zstd",&compress);
          local_428 = &local_4f0;
          local_420 = 5;
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
          ::allocator(&local_50e);
          __l._M_len = local_420;
          __l._M_array = local_428;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
          ::map(&(anonymous_namespace)::
                 HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                 ::compressionTypeMap_abi_cxx11_,__l,&local_50d,&local_50e);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
          ::~allocator(&local_50e);
          local_8d8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                       *)&local_428;
          do {
            local_8d8 = local_8d8 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
            ::~pair(local_8d8);
          } while (local_8d8 != &local_4f0);
          __cxa_atexit(std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                       ::~map,&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_);
        }
      }
      typeIt._M_node._4_4_ = TarCompressNone;
      local_520._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
           ::find(&(anonymous_namespace)::
                   HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::compressionTypeMap_abi_cxx11_,
                  (key_type *)((long)&parsedArgs.Format.field_2 + 8));
      local_528._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
           ::end(&(anonymous_namespace)::
                  HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::compressionTypeMap_abi_cxx11_);
      bVar2 = std::operator!=(&local_520,&local_528);
      if (bVar2) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
                 ::operator->(&local_520);
        typeIt._M_node._4_4_ = ppVar7->second;
      }
      else {
        uVar6 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar6 & 1) == 0) {
          cmAlphaNum::cmAlphaNum(&local_578,"compression type ");
          cmAlphaNum::cmAlphaNum
                    ((cmAlphaNum *)local_5a8,(string *)((long)&parsedArgs.Format.field_2 + 8));
          cmStrCat<char[18]>(&local_548,&local_578,(cmAlphaNum *)local_5a8,(char (*) [18])0xc7d30a);
          cmExecutionStatus::SetError(pcVar1,&local_548);
          std::__cxx11::string::~string((string *)&local_548);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          goto LAB_003bd390;
        }
      }
      local_5ac = 0;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        lVar8 = std::__cxx11::string::size();
        if (lVar8 != 1) {
          pcVar9 = (char *)std::__cxx11::string::operator[]
                                     ((ulong)((long)&parsedArgs.Compression.field_2 + 8));
          iVar3 = isdigit((int)*pcVar9);
          pcVar1 = local_20;
          if (iVar3 == 0) {
            cmAlphaNum::cmAlphaNum(&local_600,"compression level ");
            cmAlphaNum::cmAlphaNum(&local_630,(string *)((long)&parsedArgs.Compression.field_2 + 8))
            ;
            cmStrCat<char[27]>(&local_5d0,&local_600,&local_630,
                               (char (*) [27])" should be in range 0 to 9");
            cmExecutionStatus::SetError(pcVar1,&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            cmSystemTools::SetFatalErrorOccurred();
            args_local._7_1_ = 0;
            goto LAB_003bd390;
          }
        }
        local_5ac = std::__cxx11::stoi((string *)((long)&parsedArgs.Compression.field_2 + 8),
                                       (size_t *)0x0,10);
        pcVar1 = local_20;
        if ((local_5ac < 0) || (9 < local_5ac)) {
          cmAlphaNum::cmAlphaNum(&local_680,"compression level ");
          cmAlphaNum::cmAlphaNum(&local_6b0,(string *)((long)&parsedArgs.Compression.field_2 + 8));
          cmStrCat<char[27]>(&local_650,&local_680,&local_6b0,
                             (char (*) [27])" should be in range 0 to 9");
          cmExecutionStatus::SetError(pcVar1,&local_650);
          std::__cxx11::string::~string((string *)&local_650);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          goto LAB_003bd390;
        }
        if (typeIt._M_node._4_4_ == TarCompressNone) {
          cmAlphaNum::cmAlphaNum
                    (&local_700,"compression level is not supported for compression \"None\"");
          cmAlphaNum::cmAlphaNum(&local_730,(string *)((long)&parsedArgs.Format.field_2 + 8));
          cmStrCat<>(&local_6d0,&local_700,&local_730);
          cmExecutionStatus::SetError(pcVar1,&local_6d0);
          std::__cxx11::string::~string((string *)&local_6d0);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          goto LAB_003bd390;
        }
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&parsedArgs.Verbose);
      pcVar1 = local_20;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"ARCHIVE_CREATE requires a non-empty list of PATHS",
                   &local_751);
        cmExecutionStatus::SetError(pcVar1,&local_750);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator(&local_751);
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = 0;
      }
      else {
        bVar2 = cmSystemTools::CreateTar
                          ((string *)
                           &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&parsedArgs.Verbose,typeIt._M_node._4_4_,
                           (bool)(parsedArgs.MTime.
                                  super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  .field_2._M_local_buf[8] & 1),
                           (string *)((long)&parsedArgs.CompressionLevel.field_2 + 8),
                           (string *)((long)&parsedArgs.Output.field_2 + 8),local_5ac);
        pcVar1 = local_20;
        if (bVar2) {
          args_local._7_1_ = 1;
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_7a8,"failed to compress: ");
          cmAlphaNum::cmAlphaNum
                    (&local_7d8,
                     (string *)
                     &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
          cmStrCat<>(&local_778,&local_7a8,&local_7d8);
          cmExecutionStatus::SetError(pcVar1,&local_778);
          std::__cxx11::string::~string((string *)&local_778);
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
        }
      }
    }
  }
LAB_003bd390:
  knownFormats[5]._4_4_ = 1;
  HandleArchiveCreateCommand::Arguments::~Arguments((Arguments *)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsedArgs.Paths.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleArchiveCreateCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Output;
    std::string Format;
    std::string Compression;
    std::string CompressionLevel;
    // "MTIME" should require one value, but it has long been accidentally
    // accepted without one and treated as if an empty value were given.
    // Fixing this would require a policy.
    ArgumentParser::Maybe<std::string> MTime;
    bool Verbose = false;
    // "PATHS" requires at least one value, but use a custom check below.
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Paths;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("FORMAT"_s, &Arguments::Format)
      .Bind("COMPRESSION"_s, &Arguments::Compression)
      .Bind("COMPRESSION_LEVEL"_s, &Arguments::CompressionLevel)
      .Bind("MTIME"_s, &Arguments::MTime)
      .Bind("VERBOSE"_s, &Arguments::Verbose)
      .Bind("PATHS"_s, &Arguments::Paths);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  const char* knownFormats[] = {
    "7zip", "gnutar", "pax", "paxr", "raw", "zip"
  };

  if (!parsedArgs.Format.empty() &&
      !cm::contains(knownFormats, parsedArgs.Format)) {
    status.SetError(
      cmStrCat("archive format ", parsedArgs.Format, " not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  const char* zipFileFormats[] = { "7zip", "zip" };
  if (!parsedArgs.Compression.empty() &&
      cm::contains(zipFileFormats, parsedArgs.Format)) {
    status.SetError(cmStrCat("archive format ", parsedArgs.Format,
                             " does not support COMPRESSION arguments"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  static std::map<std::string, cmSystemTools::cmTarCompression>
    compressionTypeMap = { { "None", cmSystemTools::TarCompressNone },
                           { "BZip2", cmSystemTools::TarCompressBZip2 },
                           { "GZip", cmSystemTools::TarCompressGZip },
                           { "XZ", cmSystemTools::TarCompressXZ },
                           { "Zstd", cmSystemTools::TarCompressZstd } };

  cmSystemTools::cmTarCompression compress = cmSystemTools::TarCompressNone;
  auto typeIt = compressionTypeMap.find(parsedArgs.Compression);
  if (typeIt != compressionTypeMap.end()) {
    compress = typeIt->second;
  } else if (!parsedArgs.Compression.empty()) {
    status.SetError(cmStrCat("compression type ", parsedArgs.Compression,
                             " is not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  int compressionLevel = 0;
  if (!parsedArgs.CompressionLevel.empty()) {
    if (parsedArgs.CompressionLevel.size() != 1 &&
        !std::isdigit(parsedArgs.CompressionLevel[0])) {
      status.SetError(cmStrCat("compression level ",
                               parsedArgs.CompressionLevel,
                               " should be in range 0 to 9"));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    compressionLevel = std::stoi(parsedArgs.CompressionLevel);
    if (compressionLevel < 0 || compressionLevel > 9) {
      status.SetError(cmStrCat("compression level ",
                               parsedArgs.CompressionLevel,
                               " should be in range 0 to 9"));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (compress == cmSystemTools::TarCompressNone) {
      status.SetError(cmStrCat("compression level is not supported for "
                               "compression \"None\"",
                               parsedArgs.Compression));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (parsedArgs.Paths.empty()) {
    status.SetError("ARCHIVE_CREATE requires a non-empty list of PATHS");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!cmSystemTools::CreateTar(parsedArgs.Output, parsedArgs.Paths, compress,
                                parsedArgs.Verbose, parsedArgs.MTime,
                                parsedArgs.Format, compressionLevel)) {
    status.SetError(cmStrCat("failed to compress: ", parsedArgs.Output));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}